

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_Fill(FillForm1 Fill)

{
  byte bVar1;
  const_reference pvVar2;
  code *in_RDI;
  Image image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff5c;
  uint8_t value;
  undefined6 in_stack_ffffffffffffff60;
  uint8_t in_stack_ffffffffffffff66;
  uint8_t in_stack_ffffffffffffff67;
  undefined8 in_stack_ffffffffffffff68;
  ImageTemplate<unsigned_char> *this;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar3;
  uint32_t in_stack_ffffffffffffff84;
  uint32_t in_stack_ffffffffffffff88;
  uint8_t in_stack_ffffffffffffff8f;
  undefined1 local_48 [40];
  code *local_8;
  
  this = (ImageTemplate<unsigned_char> *)&stack0xffffffffffffffe0;
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff5c);
  value = (uint8_t)(in_stack_ffffffffffffff5c >> 0x18);
  uVar3 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (this,(uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff67,in_stack_ffffffffffffff66
            );
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
             (Image *)CONCAT44(uVar3,in_stack_ffffffffffffff78));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d37cf);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &stack0xffffffffffffffe0,1);
  (*local_8)(local_48,*pvVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffe0,1);
  bVar1 = Unit_Test::verifyImage
                    ((Image *)CONCAT17(in_stack_ffffffffffffff67,
                                       CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)
                                      ),value);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d3831);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return (bool)(bVar1 & 1);
}

Assistant:

bool form1_Fill(FillForm1 Fill)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image image = uniformImage( intensity[0] );

        Fill( image, intensity[1] );

        return verifyImage( image, intensity[1] );
    }